

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

QPDFFormFieldObjectHelper * __thiscall
QPDFFormFieldObjectHelper::getTopLevelField
          (QPDFFormFieldObjectHelper *__return_storage_ptr__,QPDFFormFieldObjectHelper *this,
          bool *is_different)

{
  bool bVar1;
  byte local_112;
  QPDFObjectHandle local_f8;
  allocator<char> local_e1;
  string local_e0 [32];
  QPDFObjectHandle local_c0;
  byte local_ac;
  byte local_ab;
  byte local_aa;
  allocator<char> local_a9;
  string local_a8 [32];
  QPDFObjectHandle local_88 [2];
  QPDFObjGen local_68;
  undefined1 local_60 [8];
  set seen;
  QPDFObjectHandle top_field;
  bool *is_different_local;
  QPDFFormFieldObjectHelper *this_local;
  
  QPDFObjectHelper::oh
            ((QPDFObjectHelper *)
             &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
              _M_impl.super__Rb_tree_header._M_node_count);
  QPDFObjGen::set::set((set *)local_60);
  while( true ) {
    local_aa = 0;
    local_ab = 0;
    local_ac = 0;
    local_68 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                         ((BaseHandle *)
                          &seen.
                           super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                           ._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = QPDFObjGen::set::add((set *)local_60,local_68);
    local_112 = 0;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_aa = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_a8,"/Parent",&local_a9);
      local_ab = 1;
      QPDFObjectHandle::getKeyIfDict
                (local_88,(string *)
                          &seen.
                           super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                           ._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_ac = 1;
      bVar1 = QPDFObjectHandle::isNull(local_88);
      local_112 = bVar1 ^ 0xff;
    }
    if ((local_ac & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(local_88);
    }
    if ((local_ab & 1) != 0) {
      std::__cxx11::string::~string(local_a8);
    }
    if ((local_aa & 1) != 0) {
      std::allocator<char>::~allocator(&local_a9);
    }
    if ((local_112 & 1) == 0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"/Parent",&local_e1);
    QPDFObjectHandle::getKey
              (&local_c0,
               (string *)
               &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
                _M_impl.super__Rb_tree_header._M_node_count);
    QPDFObjectHandle::operator=
              ((QPDFObjectHandle *)
               &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
                _M_impl.super__Rb_tree_header._M_node_count,&local_c0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_c0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    if (is_different != (bool *)0x0) {
      *is_different = true;
    }
  }
  QPDFObjectHandle::QPDFObjectHandle
            (&local_f8,
             (QPDFObjectHandle *)
             &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
              _M_impl.super__Rb_tree_header._M_node_count);
  QPDFFormFieldObjectHelper(__return_storage_ptr__,&local_f8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
  QPDFObjGen::set::~set((set *)local_60);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
              _M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

QPDFFormFieldObjectHelper
QPDFFormFieldObjectHelper::getTopLevelField(bool* is_different)
{
    auto top_field = oh();
    QPDFObjGen::set seen;
    while (seen.add(top_field) && !top_field.getKeyIfDict("/Parent").isNull()) {
        top_field = top_field.getKey("/Parent");
        if (is_different) {
            *is_different = true;
        }
    }
    return {top_field};
}